

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O0

void __thiscall
so_5::impl::coop_repository_details::deregistration_processor_t::second_stage
          (deregistration_processor_t *this)

{
  bool bVar1;
  __shared_ptr_access<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  exception *x;
  __normal_iterator<std::shared_ptr<so_5::coop_t>_*,_std::vector<std::shared_ptr<so_5::coop_t>,_std::allocator<std::shared_ptr<so_5::coop_t>_>_>_>
  local_38 [3];
  int local_1c;
  __normal_iterator<std::shared_ptr<so_5::coop_t>_*,_std::vector<std::shared_ptr<so_5::coop_t>,_std::allocator<std::shared_ptr<so_5::coop_t>_>_>_>
  local_18;
  iterator it;
  deregistration_processor_t *this_local;
  
  it._M_current = (shared_ptr<so_5::coop_t> *)this;
  local_18._M_current =
       (shared_ptr<so_5::coop_t> *)
       std::vector<std::shared_ptr<so_5::coop_t>,_std::allocator<std::shared_ptr<so_5::coop_t>_>_>::
       begin(&this->m_coops_to_dereg);
  p_Var2 = (__shared_ptr_access<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<so_5::coop_t>_*,_std::vector<std::shared_ptr<so_5::coop_t>,_std::allocator<std::shared_ptr<so_5::coop_t>_>_>_>
           ::operator*(&local_18);
  peVar3 = std::__shared_ptr_access<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(p_Var2);
  local_1c = (this->m_root_coop_dereg_reason).m_reason;
  coop_private_iface_t::do_deregistration_specific_actions(peVar3,(coop_dereg_reason_t)local_1c);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<so_5::coop_t>_*,_std::vector<std::shared_ptr<so_5::coop_t>,_std::allocator<std::shared_ptr<so_5::coop_t>_>_>_>
  ::operator++(&local_18);
  while( true ) {
    local_38[0]._M_current =
         (shared_ptr<so_5::coop_t> *)
         std::vector<std::shared_ptr<so_5::coop_t>,_std::allocator<std::shared_ptr<so_5::coop_t>_>_>
         ::end(&this->m_coops_to_dereg);
    bVar1 = __gnu_cxx::operator!=(&local_18,local_38);
    if (!bVar1) break;
    p_Var2 = (__shared_ptr_access<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<so_5::coop_t>_*,_std::vector<std::shared_ptr<so_5::coop_t>,_std::allocator<std::shared_ptr<so_5::coop_t>_>_>_>
             ::operator*(&local_18);
    peVar3 = std::__shared_ptr_access<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(p_Var2);
    coop_dereg_reason_t::coop_dereg_reason_t((coop_dereg_reason_t *)((long)&x + 4),2);
    coop_private_iface_t::do_deregistration_specific_actions(peVar3,x._4_4_);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<so_5::coop_t>_*,_std::vector<std::shared_ptr<so_5::coop_t>,_std::allocator<std::shared_ptr<so_5::coop_t>_>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void
deregistration_processor_t::second_stage()
{
	// Exceptions must lead to abort at this deregistration stage.
	try
	{
		// All cooperations should start deregistration actions.
		auto it = m_coops_to_dereg.begin();

		// The first item in that vector is a root cooperation.
		// So the actual coop_dereg_reason should be used for it.
		coop_private_iface_t::do_deregistration_specific_actions(
				**it, std::move( m_root_coop_dereg_reason ) );

		// A special value must be used for all other coops.
		for(++it; it != m_coops_to_dereg.end(); ++it )
		{
			coop_private_iface_t::do_deregistration_specific_actions(
					**it,
					coop_dereg_reason_t( dereg_reason::parent_deregistration ) );
		}
	}
	catch( const std::exception & x )
	{
		initiate_abort_on_exception( x );
	}
}